

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O2

bool __thiscall Bipartition::isEmpty(Bipartition *this)

{
  bool bVar1;
  
  bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::none
                    (&this->partition);
  if (bVar1) {
    return true;
  }
  bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::all
                    (&this->partition);
  return bVar1;
}

Assistant:

bool Bipartition::isEmpty() {
    return partition.none() || partition.all();
}